

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

void __thiscall
adios2sys::CommandLineArguments::GetRemainingArguments
          (CommandLineArguments *this,int *argc,char ***argv)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  size_type sVar3;
  ulong uVar4;
  undefined8 *puVar5;
  long lVar6;
  void *pvVar7;
  char *pcVar8;
  undefined8 *in_RDX;
  int *in_RSI;
  long *in_RDI;
  int cnt;
  char **args;
  size_type cc;
  size_type size;
  int local_34;
  ulong local_28;
  
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)*in_RDI);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (sVar3 - *(long *)(*in_RDI + 0x78)) + 1;
  uVar4 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  puVar5 = (undefined8 *)operator_new__(uVar4);
  lVar6 = std::__cxx11::string::size();
  pvVar7 = operator_new__(lVar6 + 1);
  *puVar5 = pvVar7;
  pcVar1 = (char *)*puVar5;
  pcVar8 = (char *)std::__cxx11::string::c_str();
  strcpy(pcVar1,pcVar8);
  local_34 = 1;
  local_28 = *(ulong *)(*in_RDI + 0x78);
  while( true ) {
    local_28 = local_28 + 1;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)*in_RDI);
    if (sVar3 <= local_28) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)*in_RDI,local_28);
    lVar6 = std::__cxx11::string::size();
    pvVar7 = operator_new__(lVar6 + 1);
    puVar5[local_34] = pvVar7;
    pcVar1 = (char *)puVar5[local_34];
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)*in_RDI,local_28);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    strcpy(pcVar1,pcVar8);
    local_34 = local_34 + 1;
  }
  *in_RSI = local_34;
  *in_RDX = puVar5;
  return;
}

Assistant:

void CommandLineArguments::GetRemainingArguments(int* argc, char*** argv)
{
  CommandLineArguments::Internal::VectorOfStrings::size_type size =
    this->Internals->Argv.size() - this->Internals->LastArgument + 1;
  CommandLineArguments::Internal::VectorOfStrings::size_type cc;

  // Copy Argv0 as the first argument
  char** args = new char*[size];
  args[0] = new char[this->Internals->Argv0.size() + 1];
  strcpy(args[0], this->Internals->Argv0.c_str());
  int cnt = 1;

  // Copy everything after the LastArgument, since that was not parsed.
  for (cc = this->Internals->LastArgument + 1;
       cc < this->Internals->Argv.size(); cc++) {
    args[cnt] = new char[this->Internals->Argv[cc].size() + 1];
    strcpy(args[cnt], this->Internals->Argv[cc].c_str());
    cnt++;
  }
  *argc = cnt;
  *argv = args;
}